

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValidSchema.cc
# Opt level: O0

bool avro::validate(NodePtr *node,SymbolMap *symbolMap)

{
  const_iterator __position;
  bool bVar1;
  uint uVar2;
  Type TVar3;
  int iVar4;
  int iVar5;
  type pNVar6;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  undefined4 extraout_var;
  undefined8 uVar8;
  Exception *this;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  type pNVar9;
  pointer ppVar10;
  NodePtr *in_RSI;
  shared_ptr<avro::Node> *in_RDI;
  NodePtr *leaf;
  size_t i;
  size_t leaves;
  shared_ptr<avro::NodeSymbolic> symNode;
  bool found;
  iterator it;
  Name *nm;
  pair<avro::Name,_boost::shared_ptr<avro::Node>_> *in_stack_fffffffffffffcd8;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffce0;
  undefined4 in_stack_fffffffffffffce8;
  undefined4 in_stack_fffffffffffffcec;
  NodeSymbolic *in_stack_fffffffffffffcf0;
  format *in_stack_fffffffffffffd18;
  Exception *in_stack_fffffffffffffd20;
  bool local_2c1;
  undefined4 in_stack_fffffffffffffd48;
  undefined4 in_stack_fffffffffffffd4c;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd50;
  ulong local_298;
  _Rb_tree_const_iterator<std::pair<const_avro::Name,_boost::shared_ptr<avro::Node>_>_> local_230;
  shared_ptr<avro::NodeSymbolic> local_228;
  undefined1 local_211;
  _Self local_130;
  bool local_121;
  _Self local_120;
  undefined8 local_118;
  undefined1 local_109;
  Type local_108;
  SymbolMap *in_stack_ffffffffffffffe0;
  NodePtr *pNVar11;
  undefined4 extraout_var_00;
  
  pNVar6 = boost::shared_ptr<avro::Node>::operator->(in_RDI);
  uVar2 = (*pNVar6->_vptr_Node[0xb])();
  if ((uVar2 & 1) == 0) {
    local_109 = 1;
    pbVar7 = (basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *)
             __cxa_allocate_exception(0x18);
    boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::basic_format
              (pbVar7,(char *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
    pNVar6 = boost::shared_ptr<avro::Node>::operator->(in_RDI);
    local_108 = Node::type(pNVar6);
    boost::basic_format<char,std::char_traits<char>,std::allocator<char>>::operator%
              (in_stack_fffffffffffffce0,(Type *)in_stack_fffffffffffffcd8);
    Exception::Exception(in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
    local_109 = 0;
    __cxa_throw(pbVar7,&Exception::typeinfo,Exception::~Exception);
  }
  pNVar6 = boost::shared_ptr<avro::Node>::operator->(in_RDI);
  uVar2 = (*pNVar6->_vptr_Node[2])();
  if ((uVar2 & 1) != 0) {
    pNVar6 = boost::shared_ptr<avro::Node>::operator->(in_RDI);
    iVar4 = (*pNVar6->_vptr_Node[3])();
    local_118 = CONCAT44(extraout_var,iVar4);
    local_120._M_node =
         (_Base_ptr)
         std::
         map<avro::Name,_boost::shared_ptr<avro::Node>,_std::less<avro::Name>,_std::allocator<std::pair<const_avro::Name,_boost::shared_ptr<avro::Node>_>_>_>
         ::find((map<avro::Name,_boost::shared_ptr<avro::Node>,_std::less<avro::Name>,_std::allocator<std::pair<const_avro::Name,_boost::shared_ptr<avro::Node>_>_>_>
                 *)in_stack_fffffffffffffcd8,(key_type *)0x1ceefe);
    local_130._M_node =
         (_Base_ptr)
         std::
         map<avro::Name,_boost::shared_ptr<avro::Node>,_std::less<avro::Name>,_std::allocator<std::pair<const_avro::Name,_boost::shared_ptr<avro::Node>_>_>_>
         ::end((map<avro::Name,_boost::shared_ptr<avro::Node>,_std::less<avro::Name>,_std::allocator<std::pair<const_avro::Name,_boost::shared_ptr<avro::Node>_>_>_>
                *)in_stack_fffffffffffffcd8);
    bVar1 = std::operator!=(&local_120,&local_130);
    local_2c1 = false;
    if (bVar1) {
      std::_Rb_tree_iterator<std::pair<const_avro::Name,_boost::shared_ptr<avro::Node>_>_>::
      operator->((_Rb_tree_iterator<std::pair<const_avro::Name,_boost::shared_ptr<avro::Node>_>_> *)
                 in_stack_fffffffffffffce0);
      local_2c1 = Name::operator==((Name *)in_stack_fffffffffffffcf0,
                                   (Name *)CONCAT44(in_stack_fffffffffffffcec,
                                                    in_stack_fffffffffffffce8));
    }
    local_121 = local_2c1;
    pNVar6 = boost::shared_ptr<avro::Node>::operator->(in_RDI);
    TVar3 = Node::type(pNVar6);
    if (TVar3 == AVRO_NUM_TYPES) {
      if ((local_121 & 1U) != 0) {
        boost::static_pointer_cast<avro::NodeSymbolic,avro::Node>
                  ((shared_ptr<avro::Node> *)
                   CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
        boost::shared_ptr<avro::NodeSymbolic>::operator->(&local_228);
        bVar1 = NodeSymbolic::isSet(in_stack_fffffffffffffcf0);
        boost::shared_ptr<avro::NodeSymbolic>::~shared_ptr
                  ((shared_ptr<avro::NodeSymbolic> *)0x1cf0dd);
        return bVar1;
      }
      local_211 = 1;
      uVar8 = __cxa_allocate_exception(0x18);
      boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::basic_format
                (in_stack_fffffffffffffd50,
                 (char *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
      pNVar6 = boost::shared_ptr<avro::Node>::operator->(in_RDI);
      iVar4 = (*pNVar6->_vptr_Node[3])();
      this = (Exception *)CONCAT44(extraout_var_00,iVar4);
      pbVar7 = boost::basic_format<char,std::char_traits<char>,std::allocator<char>>::operator%
                         (in_stack_fffffffffffffce0,&in_stack_fffffffffffffcd8->first);
      Exception::Exception(this,pbVar7);
      local_211 = 0;
      __cxa_throw(uVar8,&Exception::typeinfo,Exception::~Exception);
    }
    if ((local_121 & 1U) != 0) {
      return false;
    }
    std::_Rb_tree_const_iterator<std::pair<const_avro::Name,_boost::shared_ptr<avro::Node>_>_>::
    _Rb_tree_const_iterator(&local_230,&local_120);
    std::make_pair<avro::Name_const&,boost::shared_ptr<avro::Node>const&>
              ((Name *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8),
               (shared_ptr<avro::Node> *)in_stack_fffffffffffffce0);
    __position._M_node._4_4_ = in_stack_fffffffffffffcec;
    __position._M_node._0_4_ = in_stack_fffffffffffffce8;
    std::
    map<avro::Name,boost::shared_ptr<avro::Node>,std::less<avro::Name>,std::allocator<std::pair<avro::Name_const,boost::shared_ptr<avro::Node>>>>
    ::insert<std::pair<avro::Name,boost::shared_ptr<avro::Node>>>
              ((map<avro::Name,_boost::shared_ptr<avro::Node>,_std::less<avro::Name>,_std::allocator<std::pair<const_avro::Name,_boost::shared_ptr<avro::Node>_>_>_>
                *)in_stack_fffffffffffffce0,__position,in_stack_fffffffffffffcd8);
    std::pair<avro::Name,_boost::shared_ptr<avro::Node>_>::~pair
              ((pair<avro::Name,_boost::shared_ptr<avro::Node>_> *)in_stack_fffffffffffffce0);
  }
  pNVar6 = boost::shared_ptr<avro::Node>::operator->(in_RDI);
  Node::lock(pNVar6);
  pNVar6 = boost::shared_ptr<avro::Node>::operator->(in_RDI);
  iVar4 = (*pNVar6->_vptr_Node[4])();
  for (local_298 = 0; local_298 < CONCAT44(extraout_var_01,iVar4); local_298 = local_298 + 1) {
    pNVar6 = boost::shared_ptr<avro::Node>::operator->(in_RDI);
    iVar5 = (*pNVar6->_vptr_Node[5])(pNVar6,local_298 & 0xffffffff);
    bVar1 = validate(in_RSI,in_stack_ffffffffffffffe0);
    pNVar11 = in_RSI;
    if (!bVar1) {
      pNVar6 = boost::shared_ptr<avro::Node>::operator->(in_RDI);
      uVar2 = (uint)local_298;
      pNVar11 = in_RSI;
      pNVar9 = boost::shared_ptr<avro::Node>::operator->
                         ((shared_ptr<avro::Node> *)CONCAT44(extraout_var_02,iVar5));
      (*pNVar9->_vptr_Node[3])();
      std::
      map<avro::Name,_boost::shared_ptr<avro::Node>,_std::less<avro::Name>,_std::allocator<std::pair<const_avro::Name,_boost::shared_ptr<avro::Node>_>_>_>
      ::find((map<avro::Name,_boost::shared_ptr<avro::Node>,_std::less<avro::Name>,_std::allocator<std::pair<const_avro::Name,_boost::shared_ptr<avro::Node>_>_>_>
              *)in_RSI,(key_type *)0x1cf2a5);
      ppVar10 = std::_Rb_tree_iterator<std::pair<const_avro::Name,_boost::shared_ptr<avro::Node>_>_>
                ::operator->((_Rb_tree_iterator<std::pair<const_avro::Name,_boost::shared_ptr<avro::Node>_>_>
                              *)pNVar6);
      (*pNVar6->_vptr_Node[0xf])(pNVar6,(ulong)uVar2,&ppVar10->second);
    }
    in_RSI = pNVar11;
  }
  return true;
}

Assistant:

static bool validate(const NodePtr &node, SymbolMap &symbolMap) 
{
    if (! node->isValid()) {
        throw Exception(format("Schema is invalid, due to bad node of type %1%")
            % node->type());
    }

    if (node->hasName()) {
        const Name& nm = node->name();
        SymbolMap::iterator it = symbolMap.find(nm);
        bool found = it != symbolMap.end() && nm == it->first;

        if (node->type() == AVRO_SYMBOLIC) {
            if (! found) {
                throw Exception(format("Symbolic name \"%1%\" is unknown") %
                    node->name());
            }

            shared_ptr<NodeSymbolic> symNode =
                static_pointer_cast<NodeSymbolic>(node);

            // if the symbolic link is already resolved, we return true,
            // otherwise returning false will force it to be resolved
            return symNode->isSet();
        }

        if (found) {
            return false;
        }
        symbolMap.insert(it, make_pair(nm, node));
    }

    node->lock();
    size_t leaves = node->leaves();
    for (size_t i = 0; i < leaves; ++i) {
        const NodePtr &leaf(node->leafAt(i));

        if (! validate(leaf, symbolMap)) {

            // if validate returns false it means a node with this name already
            // existed in the map, instead of keeping this node twice in the
            // map (which could potentially create circular shared pointer
            // links that could not be easily freed), replace this node with a
            // symbolic link to the original one.
            
            node->setLeafToSymbolic(i, symbolMap.find(leaf->name())->second);
        }
    }

    return true;
}